

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

QPDF_ERROR_CODE qpdf_update_from_json_data(qpdf_data qpdf,char *buffer,unsigned_long_long size)

{
  QPDF_ERROR_CODE QVar1;
  Buffer *this;
  uchar *buf;
  shared_ptr<BufferInputSource> is;
  Buffer *b;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  this = (Buffer *)operator_new(8);
  buf = QUtil::unsigned_char_pointer(buffer);
  Buffer::Buffer(this,buf,size);
  b = this;
  std::make_shared<BufferInputSource,char_const*&,Buffer*&,bool>
            ((char **)&is,(Buffer **)&qpdf->filename,(bool *)&b);
  local_40._8_8_ = 0;
  local_28 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1930:32)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1930:32)>
             ::_M_manager;
  local_40._M_unused._M_object = &is;
  QVar1 = trap_errors(qpdf,(function<void_(_qpdf_data_*)> *)&local_40);
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&is.super___shared_ptr<BufferInputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return QVar1;
}

Assistant:

QPDF_ERROR_CODE
qpdf_update_from_json_data(qpdf_data qpdf, char const* buffer, unsigned long long size)
{
    QPDF_ERROR_CODE status = QPDF_SUCCESS;
    auto b = new Buffer(QUtil::unsigned_char_pointer(buffer), QIntC::to_size(size));
    auto is = std::make_shared<BufferInputSource>(qpdf->filename, b, true);
    status = trap_errors(qpdf, [&is](qpdf_data q) { q->qpdf->updateFromJSON(is); });
    return status;
}